

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O0

int sm2_sig_asn1_decode(uint8_t *r,uint8_t *s,uint8_t *sig,int siglen)

{
  uint uVar1;
  int iVar2;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  int total_len;
  int s_asn1_len;
  int r_asn1_len;
  int ret;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  
  iVar3 = 0;
  if ((((in_RDX != (char *)0x0) && (in_RDI != 0)) && (in_RSI != 0)) && (*in_RDX == '0')) {
    uVar1 = (uint)(byte)in_RDX[1];
    if (((uVar1 < 0x47) && (in_ECX == uVar1 + 2)) &&
       ((iVar2 = sm2_bn_asn1_decode((uint8_t *)((ulong)in_ECX << 0x20),
                                    (int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),
                                    (uint8_t *)(ulong)CONCAT14(in_RDX[1],in_stack_ffffffffffffffd0))
        , iVar2 != 0 &&
        (iVar2 = sm2_bn_asn1_decode((uint8_t *)CONCAT44(in_ECX,iVar3),
                                    (int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),
                                    (uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0)),
        iVar2 != 0)))) {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int sm2_sig_asn1_decode(uint8_t r[32], uint8_t s[32], uint8_t sig[128], int siglen)
{
    int ret = GML_ERROR;
    int r_asn1_len, s_asn1_len;
    int total_len;

    if (sig == NULL || r == NULL || s == NULL)
        goto end;

    if (*sig != 0x30U) // sig = 0x30 ?? 02 ?? r 02 ?? s
        goto end;
    sig++;

    total_len = (int)(*sig); // sig = ?? 02 ?? r 02 ?? s
    if (total_len > 0x46 || siglen != (total_len + 2))
        goto end;
    sig++;

    if (sm2_bn_asn1_decode(r, &r_asn1_len, sig) == GML_ERROR)
        goto end;
    sig += r_asn1_len;

    if (sm2_bn_asn1_decode(s, &s_asn1_len, sig) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}